

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall Pl_Flate::Members::~Members(Members *this)

{
  z_stream *zstream;
  Members *this_local;
  
  if ((this->initialized & 1U) != 0) {
    if (this->action == a_deflate) {
      deflateEnd(this->zdata);
    }
    else {
      inflateEnd(this->zdata);
    }
  }
  if (this->zdata != (void *)0x0) {
    operator_delete(this->zdata,0x70);
  }
  this->zdata = (void *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->zopfli_buf);
  std::function<void_(const_char_*,_int)>::~function(&this->callback);
  std::shared_ptr<unsigned_char>::~shared_ptr(&this->outbuf);
  return;
}

Assistant:

Pl_Flate::Members::~Members()
{
    if (this->initialized) {
        z_stream& zstream = *(static_cast<z_stream*>(this->zdata));
        if (action == a_deflate) {
            deflateEnd(&zstream);
        } else {
            inflateEnd(&zstream);
        }
    }

    delete static_cast<z_stream*>(this->zdata);
    this->zdata = nullptr;
}